

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle-allocator.hh
# Opt level: O0

bool __thiscall
tinyusdz::HandleAllocator<unsigned_long>::Release
          (HandleAllocator<unsigned_long> *this,unsigned_long handle)

{
  unsigned_long local_20;
  unsigned_long handle_local;
  HandleAllocator<unsigned_long> *this_local;
  
  if (handle == this->counter_ - 1) {
    if (this->counter_ < 2) {
      return false;
    }
    this->counter_ = this->counter_ - 1;
  }
  else {
    if (handle == 0) {
      return false;
    }
    local_20 = handle;
    handle_local = (unsigned_long)this;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->freeList_,&local_20);
    this->dirty_ = true;
  }
  return true;
}

Assistant:

bool Release(const T handle) {
    if (handle == counter_ - static_cast<T>(1)) {
      if (counter_ > static_cast<T>(1)) {
        counter_--;
      } else {
        return false;
      }
    } else {
      if (handle >= static_cast<T>(1)) {
        freeList_.push_back(handle);
        // Delay sort until required
        dirty_ = true;
      } else {
        // invalid handle
        return false;
      }
    }

    return true;
  }